

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseTemplateTemplateParam(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    bVar3 = ParseTemplateParam(state);
    bVar4 = true;
    if (!bVar3) {
      bVar4 = ParseSubstitution(state,false);
    }
  }
  else {
    bVar4 = false;
  }
  state->recursion_depth = state->recursion_depth + -1;
  return bVar4;
}

Assistant:

static bool ParseTemplateTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  return (ParseTemplateParam(state) ||
          // "std" on its own isn't a template.
          ParseSubstitution(state, /*accept_std=*/false));
}